

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliX.hpp
# Opt level: O0

int __thiscall
qclab::qgates::PauliX<std::complex<double>_>::toQASM
          (PauliX<std::complex<double>_> *this,ostream *stream,int offset)

{
  __string_type local_40;
  int local_1c;
  ostream *poStack_18;
  int offset_local;
  ostream *stream_local;
  PauliX<std::complex<double>_> *this_local;
  
  local_1c = offset;
  poStack_18 = stream;
  stream_local = (ostream *)this;
  qasmX_abi_cxx11_(&local_40,
                   (qclab *)(ulong)(uint)((this->super_QGate1<std::complex<double>_>).qubit_ +
                                         offset),offset);
  std::operator<<(stream,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmX( this->qubit_ + offset ) ;
          return 0 ;
        }